

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O0

void __thiscall
TEST_MockHierarchyTest_getMockSupportScope_TestShell::
~TEST_MockHierarchyTest_getMockSupportScope_TestShell
          (TEST_MockHierarchyTest_getMockSupportScope_TestShell *this)

{
  TEST_MockHierarchyTest_getMockSupportScope_TestShell *this_local;
  
  ~TEST_MockHierarchyTest_getMockSupportScope_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockHierarchyTest, getMockSupportScope)
{
    MockSupport* mock1 = mock().getMockSupportScope("name");
    MockSupport* mock2 = mock().getMockSupportScope("differentName");

    CHECK(!mock().hasData("name"));
    CHECK(mock1 != mock2);
    POINTERS_EQUAL(mock1, mock().getMockSupportScope("name"));
    CHECK(mock1 != &mock());
}